

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TypePrinter.cpp
# Opt level: O0

void __thiscall slang::ast::TypePrinter::printAKA(TypePrinter *this,Type *type)

{
  string_view *psVar1;
  basic_string_view<char,_std::char_traits<char>_> __x;
  basic_string_view<char,_std::char_traits<char>_> __y;
  Type *this_00;
  bool bVar2;
  TypeAliasType *pTVar3;
  pointer pFVar4;
  string_view local_78;
  basic_string_view<char,_std::char_traits<char>_> local_68;
  string_view local_58;
  size_t local_48;
  char *local_40;
  size_t local_38;
  char *local_30;
  Type *local_28;
  Type *newTarget;
  Type *target;
  Type *type_local;
  TypePrinter *this_local;
  
  newTarget = type;
  target = type;
  type_local = (Type *)this;
  while (bVar2 = Type::isAlias(newTarget), bVar2) {
    pTVar3 = Symbol::as<slang::ast::TypeAliasType>(&newTarget->super_Symbol);
    local_28 = DeclaredType::getType(&pTVar3->targetType);
    bVar2 = std::basic_string_view<char,_std::char_traits<char>_>::empty
                      (&(local_28->super_Symbol).name);
    if (((bVar2) && (bVar2 = Type::isArray(local_28), !bVar2)) &&
       (bVar2 = Type::isVirtualInterface(local_28), !bVar2)) break;
    newTarget = local_28;
  }
  if (newTarget != target) {
    psVar1 = &(newTarget->super_Symbol).name;
    local_38 = psVar1->_M_len;
    local_30 = (newTarget->super_Symbol).name._M_str;
    __x._M_len = psVar1->_M_len;
    __x._M_str = psVar1->_M_str;
    psVar1 = &(target->super_Symbol).name;
    local_48 = psVar1->_M_len;
    local_40 = (target->super_Symbol).name._M_str;
    __y._M_len = psVar1->_M_len;
    __y._M_str = psVar1->_M_str;
    bVar2 = std::operator!=(__x,__y);
    if (bVar2) {
      pFVar4 = std::unique_ptr<slang::FormatBuffer,_std::default_delete<slang::FormatBuffer>_>::
               operator->(&this->buffer);
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_58," (aka \'")
      ;
      FormatBuffer::append(pFVar4,local_58);
      this_00 = newTarget;
      local_68 = sv("",0);
      Symbol::visit<slang::ast::TypePrinter&,std::basic_string_view<char,std::char_traits<char>>>
                (&this_00->super_Symbol,this,&local_68);
      pFVar4 = std::unique_ptr<slang::FormatBuffer,_std::default_delete<slang::FormatBuffer>_>::
               operator->(&this->buffer);
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_78,"\')");
      FormatBuffer::append(pFVar4,local_78);
    }
  }
  return;
}

Assistant:

void TypePrinter::printAKA(const Type& type) {
    // Only print the AKA if the target type has a real name.
    // The typedefs can chain, so we want to walk down the chain
    // and take the last named type we see.
    const Type* target = &type;
    while (target->isAlias()) {
        const Type& newTarget = target->as<TypeAliasType>().targetType.getType();
        if (newTarget.name.empty() && !newTarget.isArray() && !newTarget.isVirtualInterface())
            break;

        target = &newTarget;
    }

    if (target != &type && target->name != type.name) {
        buffer->append(" (aka '");
        target->visit(*this, ""sv);
        buffer->append("')");
    }
}